

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1710::run(TestCase1710 *this)

{
  Builder builder;
  ArrayPtr<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader>
  lists_00;
  initializer_list<unsigned_long> values;
  bool bVar1;
  Orphanage OVar2;
  ArrayPtr<const_char> AVar3;
  bool local_901;
  undefined1 local_900 [7];
  bool _kj_shouldLog_7;
  bool local_8ca;
  DebugExpression<bool> local_8c9;
  undefined1 local_8c8 [7];
  DebugExpression<bool> _kjCondition_8;
  int64_t local_898;
  int local_890;
  bool local_889;
  undefined1 local_888 [7];
  bool _kj_shouldLog_6;
  int64_t local_858;
  int local_850;
  DebugExpression<int> local_84c;
  undefined1 local_848 [8];
  DebugComparison<int,_long> _kjCondition_7;
  undefined1 local_818 [7];
  bool _kj_shouldLog_5;
  bool local_7e2;
  DebugExpression<bool> local_7e1;
  undefined1 local_7e0 [7];
  DebugExpression<bool> _kjCondition_6;
  int64_t local_7b0;
  int local_7a8;
  bool local_7a1;
  undefined1 local_7a0 [7];
  bool _kj_shouldLog_4;
  int64_t local_770;
  int local_768;
  DebugExpression<int> local_764;
  undefined1 local_760 [8];
  DebugComparison<int,_long> _kjCondition_5;
  ArrayPtr<const_char> local_708;
  bool local_6f1;
  undefined1 local_6f0 [7];
  bool _kj_shouldLog_3;
  ArrayPtr<const_char> local_6c0;
  char (*local_6b0) [4];
  undefined1 local_6a8 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_4;
  int64_t local_648;
  int local_640;
  bool local_639;
  undefined1 local_638 [7];
  bool _kj_shouldLog_2;
  int64_t local_608;
  int local_600;
  DebugExpression<int> local_5fc;
  undefined1 local_5f8 [8];
  DebugComparison<int,_long> _kjCondition_3;
  ArrayPtr<const_char> local_5a0;
  bool local_589;
  undefined1 local_588 [7];
  bool _kj_shouldLog_1;
  ArrayPtr<const_char> local_558;
  char (*local_548) [4];
  undefined1 local_540 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_2;
  int64_t local_4e0;
  int local_4d8;
  bool local_4d1;
  undefined1 local_4d0 [7];
  bool _kj_shouldLog;
  int64_t local_4a0;
  int local_498;
  DebugExpression<int> local_494;
  undefined1 local_490 [8];
  DebugComparison<int,_long> _kjCondition_1;
  Fault local_460;
  Fault f;
  int local_450;
  DebugExpression<int> local_44c;
  undefined1 local_448 [8];
  DebugComparison<int,_unsigned_int> _kjCondition;
  ReaderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> cat;
  Orphanage local_3e8;
  undefined1 local_3d8 [8];
  Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> orphan3;
  ArrayPtr<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader> array;
  Reader local_378;
  undefined1 local_358 [8];
  Reader lists [2];
  BuilderFor<capnproto_test::capnp::test::TestAnyPointer> local_2b0;
  Builder local_288;
  undefined1 auStack_270 [8];
  BuilderFor<capnp::List<unsigned_long,_(capnp::Kind)0>_> list2;
  Orphan<capnproto_test::capnp::test::TestAnyPointer> orphan2;
  Builder local_218;
  Builder local_1f0;
  ArrayPtr<const_char> local_1c8;
  Builder local_1b8;
  Builder local_190;
  undefined1 local_168 [8];
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> list1;
  Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> orphan1;
  undefined1 local_110 [8];
  Orphanage orphanage;
  MallocMessageBuilder message;
  TestCase1710 *this_local;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&orphanage.capTable,0x400,GROW_HEURISTICALLY);
  OVar2 = MessageBuilder::getOrphanage((MessageBuilder *)&orphanage.capTable);
  orphanage.arena = (BuilderArena *)OVar2.capTable;
  local_110 = (undefined1  [8])OVar2.arena;
  Orphanage::newOrphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,(capnp::Kind)3>>
            ((Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> *)
             &list1.builder.structDataSize,(Orphanage *)local_110,2);
  Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_>::get
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> *)local_168,
             (Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> *)
             &list1.builder.structDataSize);
  List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_190,(Builder *)local_168,0);
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld1(&local_190,0xc);
  List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_1b8,(Builder *)local_168,0);
  Text::Reader::Reader((Reader *)&local_1c8,"foo");
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2(&local_1b8,(Reader)local_1c8);
  List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_1f0,(Builder *)local_168,1);
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld1(&local_1f0,0x22);
  List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Builder::operator[]
            (&local_218,(Builder *)local_168,1);
  Text::Reader::Reader((Reader *)&orphan2.builder.location,"bar");
  capnproto_test::capnp::test::TestOldVersion::Builder::setOld2
            (&local_218,(Reader)stack0xfffffffffffffdd8);
  Orphanage::newOrphan<capnproto_test::capnp::test::TestAnyPointer>
            ((Orphan<capnproto_test::capnp::test::TestAnyPointer> *)&list2.builder.structDataSize,
             (Orphanage *)local_110);
  Orphan<capnproto_test::capnp::test::TestAnyPointer>::get
            (&local_2b0,
             (Orphan<capnproto_test::capnp::test::TestAnyPointer> *)&list2.builder.structDataSize);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField(&local_288,&local_2b0);
  AnyPointer::Builder::initAs<capnp::List<unsigned_long,(capnp::Kind)0>>
            ((BuilderFor<capnp::List<unsigned_long,_(capnp::Kind)0>_> *)auStack_270,&local_288,2);
  lists[1].reader.nestingLimit = 0x3039;
  lists[1].reader._44_4_ = 0;
  values._M_len = 2;
  values._M_array = (iterator)&lists[1].reader.nestingLimit;
  builder.builder.capTable = (CapTableBuilder *)list2.builder.segment;
  builder.builder.segment = (SegmentBuilder *)auStack_270;
  builder.builder.ptr = (byte *)list2.builder.capTable;
  builder.builder._24_8_ = list2.builder.ptr;
  builder.builder._32_8_ = list2.builder._24_8_;
  (anonymous_namespace)::initList<capnp::List<unsigned_long,(capnp::Kind)0>::Builder>
            (builder,values);
  Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_>::getReader
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> *)local_358,
             (Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> *)
             &list1.builder.structDataSize);
  Orphan<capnproto_test::capnp::test::TestAnyPointer>::getReader
            ((ReaderFor<capnproto_test::capnp::test::TestAnyPointer> *)&array.size_,
             (Orphan<capnproto_test::capnp::test::TestAnyPointer> *)&list2.builder.structDataSize);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField
            (&local_378,(Reader *)&array.size_);
  AnyPointer::Reader::getAs<capnp::List<capnproto_test::capnp::test::TestOldVersion,(capnp::Kind)3>>
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> *)
             &lists[0].reader.nestingLimit,&local_378);
  kj::ArrayPtr<capnp::List<capnproto_test::capnp::test::TestOldVersion,(capnp::Kind)3>::Reader>::
  ArrayPtr<2ul>((ArrayPtr<capnp::List<capnproto_test::capnp::test::TestOldVersion,(capnp::Kind)3>::Reader>
                 *)&orphan3.builder.location,(Reader (*) [2])local_358);
  local_3e8 = MessageBuilder::getOrphanage((MessageBuilder *)&orphanage.capTable);
  lists_00.size_ = (size_t)array.ptr;
  lists_00.ptr = (Reader *)orphan3.builder.location;
  Orphanage::
  newOrphanConcat<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader>
            ((Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> *)
             local_3d8,&local_3e8,lists_00);
  Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_>::getReader
            ((ReaderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> *)
             &_kjCondition.result,
             (Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> *)
             local_3d8);
  local_450 = 4;
  local_44c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_450);
  f.exception._4_4_ =
       List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader::size
                 ((Reader *)&_kjCondition.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_448,&local_44c,
             (uint *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_448);
  if (bVar1) {
    local_498 = 0xc;
    local_494 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_498);
    List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader::operator[]
              ((Reader *)local_4d0,(Reader *)&_kjCondition.result,0);
    local_4a0 = capnproto_test::capnp::test::TestOldVersion::Reader::getOld1((Reader *)local_4d0);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_long> *)local_490,&local_494,&local_4a0);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_490);
    if (!bVar1) {
      local_4d1 = kj::_::Debug::shouldLog(ERROR);
      while (local_4d1 != false) {
        local_4d8 = 0xc;
        List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)&_kjCondition_2.result,(Reader *)&_kjCondition.result,0);
        local_4e0 = capnproto_test::capnp::test::TestOldVersion::Reader::getOld1
                              ((Reader *)&_kjCondition_2.result);
        kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,long>&,int,long>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x6c9,ERROR,
                   "\"failed: expected \" \"(12) == (cat[0].getOld1())\", _kjCondition, 12, cat[0].getOld1()"
                   ,(char (*) [44])"failed: expected (12) == (cat[0].getOld1())",
                   (DebugComparison<int,_long> *)local_490,&local_4d8,&local_4e0);
        local_4d1 = false;
      }
    }
    local_548 = (char (*) [4])
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
    List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader::operator[]
              ((Reader *)local_588,(Reader *)&_kjCondition.result,0);
    local_558 = (ArrayPtr<const_char>)
                capnproto_test::capnp::test::TestOldVersion::Reader::getOld2((Reader *)local_588);
    kj::_::DebugExpression<char_const(&)[4]>::operator==
              ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_540,
               (DebugExpression<char_const(&)[4]> *)&local_548,(Reader *)&local_558);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_540);
    if (!bVar1) {
      local_589 = kj::_::Debug::shouldLog(ERROR);
      while (local_589 != false) {
        List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)&_kjCondition_3.result,(Reader *)&_kjCondition.result,0);
        AVar3 = (ArrayPtr<const_char>)
                capnproto_test::capnp::test::TestOldVersion::Reader::getOld2
                          ((Reader *)&_kjCondition_3.result);
        local_5a0 = AVar3;
        kj::_::Debug::
        log<char_const(&)[47],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x6ca,ERROR,
                   "\"failed: expected \" \"(\\\"foo\\\") == (cat[0].getOld2())\", _kjCondition, \"foo\", cat[0].getOld2()"
                   ,(char (*) [47])"failed: expected (\"foo\") == (cat[0].getOld2())",
                   (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_540,
                   (char (*) [4])"foo",(Reader *)&local_5a0);
        local_589 = false;
      }
    }
    local_600 = 0x22;
    local_5fc = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_600);
    List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader::operator[]
              ((Reader *)local_638,(Reader *)&_kjCondition.result,1);
    local_608 = capnproto_test::capnp::test::TestOldVersion::Reader::getOld1((Reader *)local_638);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_long> *)local_5f8,&local_5fc,&local_608);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5f8);
    if (!bVar1) {
      local_639 = kj::_::Debug::shouldLog(ERROR);
      while (local_639 != false) {
        local_640 = 0x22;
        List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)&_kjCondition_4.result,(Reader *)&_kjCondition.result,1);
        local_648 = capnproto_test::capnp::test::TestOldVersion::Reader::getOld1
                              ((Reader *)&_kjCondition_4.result);
        kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,long>&,int,long>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x6cc,ERROR,
                   "\"failed: expected \" \"(34) == (cat[1].getOld1())\", _kjCondition, 34, cat[1].getOld1()"
                   ,(char (*) [44])"failed: expected (34) == (cat[1].getOld1())",
                   (DebugComparison<int,_long> *)local_5f8,&local_640,&local_648);
        local_639 = false;
      }
    }
    local_6b0 = (char (*) [4])
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x439e6e);
    List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader::operator[]
              ((Reader *)local_6f0,(Reader *)&_kjCondition.result,1);
    local_6c0 = (ArrayPtr<const_char>)
                capnproto_test::capnp::test::TestOldVersion::Reader::getOld2((Reader *)local_6f0);
    kj::_::DebugExpression<char_const(&)[4]>::operator==
              ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_6a8,
               (DebugExpression<char_const(&)[4]> *)&local_6b0,(Reader *)&local_6c0);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_6a8);
    if (!bVar1) {
      local_6f1 = kj::_::Debug::shouldLog(ERROR);
      while (local_6f1 != false) {
        List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)&_kjCondition_5.result,(Reader *)&_kjCondition.result,1);
        AVar3 = (ArrayPtr<const_char>)
                capnproto_test::capnp::test::TestOldVersion::Reader::getOld2
                          ((Reader *)&_kjCondition_5.result);
        local_708 = AVar3;
        kj::_::Debug::
        log<char_const(&)[47],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x6cd,ERROR,
                   "\"failed: expected \" \"(\\\"bar\\\") == (cat[1].getOld2())\", _kjCondition, \"bar\", cat[1].getOld2()"
                   ,(char (*) [47])"failed: expected (\"bar\") == (cat[1].getOld2())",
                   (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_6a8,
                   (char (*) [4])0x439e6e,(Reader *)&local_708);
        local_6f1 = false;
      }
    }
    local_768 = 0x3039;
    local_764 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_768);
    List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader::operator[]
              ((Reader *)local_7a0,(Reader *)&_kjCondition.result,2);
    local_770 = capnproto_test::capnp::test::TestOldVersion::Reader::getOld1((Reader *)local_7a0);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_long> *)local_760,&local_764,&local_770);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_760);
    if (!bVar1) {
      local_7a1 = kj::_::Debug::shouldLog(ERROR);
      while (local_7a1 != false) {
        local_7a8 = 0x3039;
        List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)local_7e0,(Reader *)&_kjCondition.result,2);
        local_7b0 = capnproto_test::capnp::test::TestOldVersion::Reader::getOld1
                              ((Reader *)local_7e0);
        kj::_::Debug::log<char_const(&)[47],kj::_::DebugComparison<int,long>&,int,long>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x6cf,ERROR,
                   "\"failed: expected \" \"(12345) == (cat[2].getOld1())\", _kjCondition, 12345, cat[2].getOld1()"
                   ,(char (*) [47])"failed: expected (12345) == (cat[2].getOld1())",
                   (DebugComparison<int,_long> *)local_760,&local_7a8,&local_7b0);
        local_7a1 = false;
      }
    }
    List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader::operator[]
              ((Reader *)local_818,(Reader *)&_kjCondition.result,2);
    bVar1 = capnproto_test::capnp::test::TestOldVersion::Reader::hasOld2((Reader *)local_818);
    local_7e2 = (bool)(~bVar1 & 1);
    local_7e1 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_7e2);
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_7e1);
    if (!bVar1) {
      _kjCondition_7._39_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_7._39_1_ != '\0') {
        kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x6d0,ERROR,"\"failed: expected \" \"!(cat[2].hasOld2())\", _kjCondition",
                   (char (*) [37])"failed: expected !(cat[2].hasOld2())",&local_7e1);
        _kjCondition_7._39_1_ = 0;
      }
    }
    local_850 = 0x10932;
    local_84c = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_850);
    List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader::operator[]
              ((Reader *)local_888,(Reader *)&_kjCondition.result,3);
    local_858 = capnproto_test::capnp::test::TestOldVersion::Reader::getOld1((Reader *)local_888);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_long> *)local_848,&local_84c,&local_858);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_848);
    if (!bVar1) {
      local_889 = kj::_::Debug::shouldLog(ERROR);
      while (local_889 != false) {
        local_890 = 0x10932;
        List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)local_8c8,(Reader *)&_kjCondition.result,3);
        local_898 = capnproto_test::capnp::test::TestOldVersion::Reader::getOld1
                              ((Reader *)local_8c8);
        kj::_::Debug::log<char_const(&)[47],kj::_::DebugComparison<int,long>&,int,long>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x6d2,ERROR,
                   "\"failed: expected \" \"(67890) == (cat[3].getOld1())\", _kjCondition, 67890, cat[3].getOld1()"
                   ,(char (*) [47])"failed: expected (67890) == (cat[3].getOld1())",
                   (DebugComparison<int,_long> *)local_848,&local_890,&local_898);
        local_889 = false;
      }
    }
    List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader::operator[]
              ((Reader *)local_900,(Reader *)&_kjCondition.result,3);
    bVar1 = capnproto_test::capnp::test::TestOldVersion::Reader::hasOld2((Reader *)local_900);
    local_8ca = (bool)(~bVar1 & 1);
    local_8c9 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_8ca);
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_8c9);
    if (!bVar1) {
      local_901 = kj::_::Debug::shouldLog(ERROR);
      while (local_901 != false) {
        kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
                   ,0x6d3,ERROR,"\"failed: expected \" \"!(cat[3].hasOld2())\", _kjCondition",
                   (char (*) [37])"failed: expected !(cat[3].hasOld2())",&local_8c9);
        local_901 = false;
      }
    }
    Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_>::~Orphan
              ((Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> *)
               local_3d8);
    Orphan<capnproto_test::capnp::test::TestAnyPointer>::~Orphan
              ((Orphan<capnproto_test::capnp::test::TestAnyPointer> *)&list2.builder.structDataSize)
    ;
    Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_>::~Orphan
              ((Orphan<capnp::List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>_> *)
               &list1.builder.structDataSize);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&orphanage.capTable);
    return;
  }
  _kjCondition_1._36_4_ = 4;
  _kjCondition_1._32_4_ =
       List<capnproto_test::capnp::test::TestOldVersion,_(capnp::Kind)3>::Reader::size
                 ((Reader *)&_kjCondition.result);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
            (&local_460,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/orphan-test.c++"
             ,0x6c7,FAILED,"(4) == (cat.size())","_kjCondition,4, cat.size()",
             (DebugComparison<int,_unsigned_int> *)local_448,(int *)&_kjCondition_1.field_0x24,
             (uint *)&_kjCondition_1.result);
  kj::_::Debug::Fault::fatal(&local_460);
}

Assistant:

TEST(Orphans, ConcatenateStructListsUpgradeFromPrimitive) {
  // Like above, but we're "upgrading" a primitive list to a struct list.

  MallocMessageBuilder message;
  auto orphanage = message.getOrphanage();

  auto orphan1 = orphanage.newOrphan<List<test::TestOldVersion>>(2);
  auto list1 = orphan1.get();
  list1[0].setOld1(12);
  list1[0].setOld2("foo");
  list1[1].setOld1(34);
  list1[1].setOld2("bar");

  auto orphan2 = orphanage.newOrphan<test::TestAnyPointer>();
  auto list2 = orphan2.get().getAnyPointerField().initAs<List<uint64_t>>(2);
  initList(list2, {12345, 67890});

  List<test::TestOldVersion>::Reader lists[] = {
    orphan1.getReader(),
    orphan2.getReader().getAnyPointerField().getAs<List<test::TestOldVersion>>()
  };
  kj::ArrayPtr<List<test::TestOldVersion>::Reader> array = lists;

  auto orphan3 = message.getOrphanage().newOrphanConcat(array);
  auto cat = orphan3.getReader();
  ASSERT_EQ(4, cat.size());

  EXPECT_EQ(12, cat[0].getOld1());
  EXPECT_EQ("foo", cat[0].getOld2());

  EXPECT_EQ(34, cat[1].getOld1());
  EXPECT_EQ("bar", cat[1].getOld2());

  EXPECT_EQ(12345, cat[2].getOld1());
  EXPECT_FALSE(cat[2].hasOld2());

  EXPECT_EQ(67890, cat[3].getOld1());
  EXPECT_FALSE(cat[3].hasOld2());
}